

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O0

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::query(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
        *this,Node *node,Box<float> *box,Box<float> *queryBox,
       vector<Node_*,_std::allocator<Node_*>_> *values)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  pointer node_00;
  undefined1 local_78 [8];
  Box<float> childBox;
  size_t i;
  reference local_50;
  Node **value;
  iterator __end0;
  iterator __begin0;
  vector<Node_*,_std::allocator<Node_*>_> *__range2;
  vector<Node_*,_std::allocator<Node_*>_> *values_local;
  Box<float> *queryBox_local;
  Box<float> *box_local;
  Node *node_local;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *this_local;
  
  __end0 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(&node->values);
  value = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&node->values);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                     *)&value), bVar2) {
    local_50 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
               ::operator*(&__end0);
    _i = anon_class_1_0_00000001_for_mGetBox::operator()
                   ((anon_class_1_0_00000001_for_mGetBox *)&this->field_0x18,*local_50);
    bVar2 = Box<float>::intersects(queryBox,(Box<float> *)&i);
    if (bVar2) {
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back(values,local_50);
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end0);
  }
  bVar2 = isLeaf(this,node);
  if (!bVar2) {
    childBox.width = 0.0;
    childBox.height = 0.0;
    for (; uVar1 = childBox._8_8_,
        sVar3 = std::
                array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
                ::size(&node->children), (ulong)uVar1 < sVar3; childBox._8_8_ = childBox._8_8_ + 1)
    {
      _local_78 = computeBox(this,box,(int)childBox.width);
      bVar2 = Box<float>::intersects(queryBox,(Box<float> *)local_78);
      if (bVar2) {
        this_00 = std::
                  array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
                  ::operator[](&node->children,childBox._8_8_);
        node_00 = std::
                  unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                  ::get(this_00);
        query(this,node_00,(Box<float> *)local_78,queryBox,values);
      }
    }
  }
  return;
}

Assistant:

void query(Node* node, const Box<Float>& box, const Box<Float>& queryBox, std::vector<T>& values) const
    {
        assert(node != nullptr);
        assert(queryBox.intersects(box));
        for (const auto& value : node->values)
        {
            if (queryBox.intersects(mGetBox(value)))
                values.push_back(value);
        }
        if (!isLeaf(node))
        {
            for (auto i = std::size_t(0); i < node->children.size(); ++i)
            {
                auto childBox = computeBox(box, static_cast<int>(i));
                if (queryBox.intersects(childBox))
                    query(node->children[i].get(), childBox, queryBox, values);
            }
        }
    }